

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::preserveObjectStreams(QPDFWriter *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  *this_00;
  pointer ppVar4;
  Object *pOVar5;
  size_type sVar6;
  reference rVar7;
  bool local_b9;
  reference local_90;
  size_type local_80;
  size_t id;
  _Base_ptr local_68;
  undefined1 local_60 [8];
  vector<bool,_std::allocator<bool>_> eligible;
  const_iterator iter_1;
  _Self local_28;
  const_iterator iter;
  const_iterator end;
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  *xref;
  QPDFWriter *this_local;
  
  peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  this_00 = QPDF::Writer::getXRefTable(peVar3->pdf);
  iter = std::
         map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
         ::cend(this_00);
  peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  (peVar3->obj).streams_empty = true;
  peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar3->preserve_unreferenced_objects & 1U) == 0) {
    eligible.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage =
         (_Bit_pointer)
         std::
         map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
         ::cbegin(this_00);
    while (bVar1 = std::operator!=((_Self *)&eligible.super__Bvector_base<std::allocator<bool>_>.
                                             _M_impl.super__Bvector_impl_data._M_end_of_storage,
                                   &iter), bVar1) {
      ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_> *)
                          &eligible.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_end_of_storage);
      iVar2 = QPDFXRefEntry::getType(&ppVar4->second);
      if (iVar2 == 2) {
        QTC::TC("qpdf","QPDFWriter preserve object streams",0);
        peVar3 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        (peVar3->obj).streams_empty = false;
        peVar3 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        QPDF::Writer::getCompressibleObjSet
                  ((vector<bool,_std::allocator<bool>_> *)local_60,peVar3->pdf);
        local_68 = (_Base_ptr)
                   std::
                   map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                   ::cbegin(this_00);
        eligible.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)local_68;
        while( true ) {
          bVar1 = std::operator!=((_Self *)&eligible.super__Bvector_base<std::allocator<bool>_>.
                                            _M_impl.super__Bvector_impl_data._M_end_of_storage,&iter
                                 );
          if (!bVar1) break;
          ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::
                   operator->((_Rb_tree_const_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>
                               *)&eligible.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_end_of_storage);
          iVar2 = QPDFXRefEntry::getType(&ppVar4->second);
          if (iVar2 == 2) {
            ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::
                     operator->((_Rb_tree_const_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>
                                 *)&eligible.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_end_of_storage);
            iVar2 = QPDFObjGen::getObj(&ppVar4->first);
            local_80 = (long)iVar2;
            sVar6 = std::vector<bool,_std::allocator<bool>_>::size
                              ((vector<bool,_std::allocator<bool>_> *)local_60);
            local_b9 = false;
            if ((ulong)(long)iVar2 < sVar6) {
              rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                ((vector<bool,_std::allocator<bool>_> *)local_60,local_80);
              local_90 = rVar7;
              local_b9 = std::_Bit_reference::operator_cast_to_bool(&local_90);
            }
            if (local_b9 == false) {
              QTC::TC("qpdf","QPDFWriter exclude from object stream",0);
            }
            else {
              ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::
                       operator->((_Rb_tree_const_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>
                                   *)&eligible.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_end_of_storage);
              iVar2 = QPDFXRefEntry::getObjStreamNumber(&ppVar4->second);
              peVar3 = std::
                       __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)this);
              ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::
                       operator->((_Rb_tree_const_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>
                                   *)&eligible.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_end_of_storage);
              pOVar5 = ObjTable<QPDFWriter::Object>::operator[]
                                 (&(peVar3->obj).super_ObjTable<QPDFWriter::Object>,ppVar4->first);
              pOVar5->object_stream = iVar2;
            }
          }
          std::_Rb_tree_const_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator++
                    ((_Rb_tree_const_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_> *)
                     &eligible.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage);
        }
        std::vector<bool,_std::allocator<bool>_>::~vector
                  ((vector<bool,_std::allocator<bool>_> *)local_60);
        return;
      }
      std::_Rb_tree_const_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator++
                ((_Rb_tree_const_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_> *)
                 &eligible.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage);
    }
  }
  else {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
         ::cbegin(this_00);
    while (bVar1 = std::operator!=(&local_28,&iter), bVar1) {
      ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator->
                         (&local_28);
      iVar2 = QPDFXRefEntry::getType(&ppVar4->second);
      if (iVar2 == 2) {
        QTC::TC("qpdf","QPDFWriter preserve object streams preserve unreferenced",0);
        peVar3 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        (peVar3->obj).streams_empty = false;
        ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::
                 operator->(&local_28);
        iVar2 = QPDFXRefEntry::getObjStreamNumber(&ppVar4->second);
        peVar3 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::
                 operator->(&local_28);
        pOVar5 = ObjTable<QPDFWriter::Object>::operator[]
                           (&(peVar3->obj).super_ObjTable<QPDFWriter::Object>,ppVar4->first);
        pOVar5->object_stream = iVar2;
      }
      std::_Rb_tree_const_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator++
                (&local_28);
    }
  }
  return;
}

Assistant:

void
QPDFWriter::preserveObjectStreams()
{
    auto const& xref = QPDF::Writer::getXRefTable(m->pdf);
    // Our object_to_object_stream map has to map ObjGen -> ObjGen since we may be generating object
    // streams out of old objects that have generation numbers greater than zero. However in an
    // existing PDF, all object stream objects and all objects in them must have generation 0
    // because the PDF spec does not provide any way to do otherwise. This code filters out objects
    // that are not allowed to be in object streams. In addition to removing objects that were
    // erroneously included in object streams in the source PDF, it also prevents unreferenced
    // objects from being included.
    auto end = xref.cend();
    m->obj.streams_empty = true;
    if (m->preserve_unreferenced_objects) {
        for (auto iter = xref.cbegin(); iter != end; ++iter) {
            if (iter->second.getType() == 2) {
                // Pdf contains object streams.
                QTC::TC("qpdf", "QPDFWriter preserve object streams preserve unreferenced");
                m->obj.streams_empty = false;
                m->obj[iter->first].object_stream = iter->second.getObjStreamNumber();
            }
        }
    } else {
        // Start by scanning for first compressed object in case we don't have any object streams to
        // process.
        for (auto iter = xref.cbegin(); iter != end; ++iter) {
            if (iter->second.getType() == 2) {
                // Pdf contains object streams.
                QTC::TC("qpdf", "QPDFWriter preserve object streams");
                m->obj.streams_empty = false;
                auto eligible = QPDF::Writer::getCompressibleObjSet(m->pdf);
                // The object pointed to by iter may be a previous generation, in which case it is
                // removed by getCompressibleObjSet. We need to restart the loop (while the object
                // table may contain multiple generations of an object).
                for (iter = xref.cbegin(); iter != end; ++iter) {
                    if (iter->second.getType() == 2) {
                        auto id = static_cast<size_t>(iter->first.getObj());
                        if (id < eligible.size() && eligible[id]) {
                            m->obj[iter->first].object_stream = iter->second.getObjStreamNumber();
                        } else {
                            QTC::TC("qpdf", "QPDFWriter exclude from object stream");
                        }
                    }
                }
                return;
            }
        }
    }
}